

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsync_semaphore_futex.c
# Opt level: O1

int __thiscall
nsync::nsync_mu_semaphore_p_with_deadline(nsync *this,nsync_semaphore *s,nsync_time abs_deadline)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  __time_t _Var6;
  nsync_semaphore **ppnVar7;
  nsync_time a;
  nsync_time a_00;
  nsync_time nVar8;
  timespec ts_buf;
  nsync_semaphore *local_48;
  __time_t _Stack_40;
  
  _Var6 = abs_deadline.tv_sec;
  while( true ) {
    iVar1 = *(int *)this;
    iVar2 = 0;
    if (iVar1 == 0) {
      nVar8.tv_nsec = 999999999;
      nVar8.tv_sec = 0x7fffffffffffffff;
      a.tv_nsec = _Var6;
      a.tv_sec = (__time_t)s;
      iVar2 = nsync_time_cmp(a,nVar8);
      if (iVar2 == 0) {
        ppnVar7 = (nsync_semaphore **)0x0;
      }
      else {
        ppnVar7 = &local_48;
        local_48 = s;
        _Stack_40 = _Var6;
      }
      lVar4 = syscall(0xca,this,0x189,0,ppnVar7,0,0xffffffff);
      iVar2 = 0;
      if ((int)lVar4 != 0) {
        piVar5 = __errno_location();
        iVar3 = *piVar5;
        if (((iVar3 != 4) && (iVar3 != 0xb)) && (iVar3 != 0x6e)) {
          _DAT_00000000 = 0;
        }
        if (iVar3 == 0x6e && (int)lVar4 == -1) {
          nVar8 = nsync_time_now();
          a_00.tv_nsec = _Var6;
          a_00.tv_sec = (__time_t)s;
          iVar3 = nsync_time_cmp(a_00,nVar8);
          iVar2 = 0x6e;
          if (0 < iVar3) {
            iVar2 = 0;
          }
        }
      }
    }
    if (iVar2 != 0) break;
    if (iVar1 != 0) {
      LOCK();
      iVar2 = *(int *)this;
      if (iVar1 == iVar2) {
        *(int *)this = iVar1 + -1;
      }
      UNLOCK();
      if (iVar1 == iVar2) {
        return 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int nsync_mu_semaphore_p_with_deadline (nsync_semaphore *s, nsync_time abs_deadline) {
	struct futex *f = (struct futex *)s;
	int i;
	int result = 0;
	do {
		i = ATM_LOAD ((nsync_atomic_uint32_ *) &f->i);
		if (i == 0) {
			int futex_result;
			struct timespec ts_buf;
			const struct timespec *ts = NULL;
			if (nsync_time_cmp (abs_deadline, nsync_time_no_deadline) != 0) {
				memset (&ts_buf, 0, sizeof (ts_buf));
				if (FUTEX_TIMEOUT_IS_ABSOLUTE) {
					ts_buf.tv_sec = NSYNC_TIME_SEC (abs_deadline);
					ts_buf.tv_nsec = NSYNC_TIME_NSEC (abs_deadline);
				} else {
					nsync_time now;
					now = nsync_time_now ();
					if (nsync_time_cmp (now, abs_deadline) > 0) {
						ts_buf.tv_sec = 0;
						ts_buf.tv_nsec = 0;
					} else {
						nsync_time rel_deadline;
						rel_deadline = nsync_time_sub (abs_deadline, now);
						ts_buf.tv_sec = NSYNC_TIME_SEC (rel_deadline);
						ts_buf.tv_nsec = NSYNC_TIME_NSEC (rel_deadline);
					}
				}
				ts = &ts_buf;
			}
			futex_result = futex (&f->i, FUTEX_WAIT_, i, ts, NULL, FUTEX_WAIT_BITS_);
			ASSERT (futex_result == 0 || errno == EINTR || errno == EWOULDBLOCK ||
				errno == ETIMEDOUT);
			/* Some systems don't wait as long as they are told. */ 
			if (futex_result == -1 && errno == ETIMEDOUT &&
			    nsync_time_cmp (abs_deadline, nsync_time_now ()) <= 0) {
				result = ETIMEDOUT;
			}
		}
	} while (result == 0 && (i == 0 || !ATM_CAS_ACQ ((nsync_atomic_uint32_ *) &f->i, i, i - 1)));
	return (result);
}